

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::TimeZoneFormat::format
          (TimeZoneFormat *this,UTimeZoneFormatStyle style,TimeZone *tz,UDate date,
          UnicodeString *name,UTimeZoneFormatTimeType *timeType)

{
  int32_t genType;
  UTimeZoneNameType dstType;
  UChar *pUVar1;
  UBool isShort;
  UBool UVar2;
  UTimeZoneNameType stdType;
  int offset;
  char16_t *srcChars;
  UBool UVar3;
  int32_t dstOffset;
  UErrorCode status;
  int32_t rawOffset;
  
  if (timeType != (UTimeZoneFormatTimeType *)0x0) {
    *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
  }
  switch(style) {
  case UTZFMT_STYLE_GENERIC_LOCATION:
    genType = 1;
    break;
  case UTZFMT_STYLE_GENERIC_LONG:
    genType = 2;
    break;
  case UTZFMT_STYLE_GENERIC_SHORT:
    genType = 4;
    break;
  case UTZFMT_STYLE_SPECIFIC_LONG:
    stdType = UTZNM_LONG_STANDARD;
    dstType = UTZNM_LONG_DAYLIGHT;
    goto LAB_00203e83;
  case UTZFMT_STYLE_SPECIFIC_SHORT:
    stdType = UTZNM_SHORT_STANDARD;
    dstType = UTZNM_SHORT_DAYLIGHT;
LAB_00203e83:
    formatSpecific(this,tz,stdType,dstType,date,name,timeType);
  default:
    goto switchD_00203e01_caseD_5;
  case UTZFMT_STYLE_ZONE_ID:
    UnicodeString::operator=(name,&tz->fID);
    return name;
  case UTZFMT_STYLE_ZONE_ID_SHORT:
    pUVar1 = ZoneMeta::getShortID(tz);
    srcChars = L"unk";
    if (pUVar1 != (UChar *)0x0) {
      srcChars = pUVar1;
    }
    UnicodeString::setTo(name,srcChars,-1);
    return name;
  case UTZFMT_STYLE_EXEMPLAR_LOCATION:
    formatExemplarLocation(this,tz,name);
    return name;
  }
  formatGeneric(this,tz,genType,date,name);
switchD_00203e01_caseD_5:
  if (0x1f < (ushort)(name->fUnion).fStackFields.fLengthAndFlags) {
    return name;
  }
  status = U_ZERO_ERROR;
  (*(tz->super_UObject)._vptr_UObject[6])(date,tz,0,&rawOffset,&dstOffset);
  if (U_ZERO_ERROR < status) {
    return name;
  }
  if (UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FULL < style) goto LAB_00203ff5;
  offset = dstOffset + rawOffset;
  switch(style) {
  default:
    formatOffsetLocalizedGMT(this,offset,name,&status);
    goto LAB_00203ff5;
  case UTZFMT_STYLE_GENERIC_SHORT:
  case UTZFMT_STYLE_SPECIFIC_SHORT:
  case UTZFMT_STYLE_LOCALIZED_GMT_SHORT:
    formatOffsetShortLocalizedGMT(this,offset,name,&status);
    goto LAB_00203ff5;
  case UTZFMT_STYLE_ISO_BASIC_SHORT:
    UVar2 = '\x01';
    goto LAB_00203f89;
  case UTZFMT_STYLE_ISO_BASIC_LOCAL_SHORT:
    UVar2 = '\0';
LAB_00203f89:
    isShort = '\x01';
    UVar3 = '\x01';
    break;
  case UTZFMT_STYLE_ISO_BASIC_FIXED:
    UVar2 = '\x01';
    isShort = '\0';
    UVar3 = UVar2;
    break;
  case UTZFMT_STYLE_ISO_BASIC_LOCAL_FIXED:
    UVar2 = '\0';
    isShort = '\0';
    UVar3 = '\x01';
    break;
  case UTZFMT_STYLE_ISO_BASIC_FULL:
    UVar2 = '\x01';
    goto LAB_00203fa7;
  case UTZFMT_STYLE_ISO_BASIC_LOCAL_FULL:
    UVar2 = '\0';
LAB_00203fa7:
    isShort = '\0';
    UVar3 = '\0';
    break;
  case UTZFMT_STYLE_ISO_EXTENDED_FIXED:
    UVar2 = '\x01';
    UVar3 = UVar2;
    goto LAB_00203fed;
  case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FIXED:
    UVar2 = '\0';
    UVar3 = '\x01';
    goto LAB_00203fed;
  case UTZFMT_STYLE_ISO_EXTENDED_FULL:
    UVar2 = '\x01';
    goto LAB_00203fd5;
  case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FULL:
    UVar2 = '\0';
LAB_00203fd5:
    UVar3 = '\0';
LAB_00203fed:
    formatOffsetISO8601Extended(this,offset,UVar2,'\0',UVar3,name,&status);
    goto LAB_00203ff5;
  }
  formatOffsetISO8601Basic(this,offset,UVar2,isShort,UVar3,name,&status);
LAB_00203ff5:
  if (timeType != (UTimeZoneFormatTimeType *)0x0) {
    *timeType = UTZFMT_TIME_TYPE_DAYLIGHT - (dstOffset == 0);
  }
  return name;
}

Assistant:

UnicodeString&
TimeZoneFormat::format(UTimeZoneFormatStyle style, const TimeZone& tz, UDate date,
        UnicodeString& name, UTimeZoneFormatTimeType* timeType /* = NULL */) const {
    if (timeType) {
        *timeType = UTZFMT_TIME_TYPE_UNKNOWN;
    }

    UBool noOffsetFormatFallback = FALSE;

    switch (style) {
    case UTZFMT_STYLE_GENERIC_LOCATION:
        formatGeneric(tz, UTZGNM_LOCATION, date, name);
        break;
    case UTZFMT_STYLE_GENERIC_LONG:
        formatGeneric(tz, UTZGNM_LONG, date, name);
        break;
    case UTZFMT_STYLE_GENERIC_SHORT:
        formatGeneric(tz, UTZGNM_SHORT, date, name);
        break;
    case UTZFMT_STYLE_SPECIFIC_LONG:
        formatSpecific(tz, UTZNM_LONG_STANDARD, UTZNM_LONG_DAYLIGHT, date, name, timeType);
        break;
    case UTZFMT_STYLE_SPECIFIC_SHORT:
        formatSpecific(tz, UTZNM_SHORT_STANDARD, UTZNM_SHORT_DAYLIGHT, date, name, timeType);
        break;

    case UTZFMT_STYLE_ZONE_ID:
        tz.getID(name);
        noOffsetFormatFallback = TRUE;
        break;
    case UTZFMT_STYLE_ZONE_ID_SHORT:
        {
            const UChar* shortID = ZoneMeta::getShortID(tz);
            if (shortID == NULL) {
                shortID = UNKNOWN_SHORT_ZONE_ID;
            }
            name.setTo(shortID, -1);
        }
        noOffsetFormatFallback = TRUE;
        break;

    case UTZFMT_STYLE_EXEMPLAR_LOCATION:
        formatExemplarLocation(tz, name);
        noOffsetFormatFallback = TRUE;
        break;

    default:
        // will be handled below
        break;
    }

    if (name.isEmpty() && !noOffsetFormatFallback) {
        UErrorCode status = U_ZERO_ERROR;
        int32_t rawOffset, dstOffset;
        tz.getOffset(date, FALSE, rawOffset, dstOffset, status);
        int32_t offset = rawOffset + dstOffset;
        if (U_SUCCESS(status)) {
            switch (style) {
            case UTZFMT_STYLE_GENERIC_LOCATION:
            case UTZFMT_STYLE_GENERIC_LONG:
            case UTZFMT_STYLE_SPECIFIC_LONG:
            case UTZFMT_STYLE_LOCALIZED_GMT:
                formatOffsetLocalizedGMT(offset, name, status);
                break;

            case UTZFMT_STYLE_GENERIC_SHORT:
            case UTZFMT_STYLE_SPECIFIC_SHORT:
            case UTZFMT_STYLE_LOCALIZED_GMT_SHORT:
                formatOffsetShortLocalizedGMT(offset, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_SHORT:
                formatOffsetISO8601Basic(offset, TRUE, TRUE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_LOCAL_SHORT:
                formatOffsetISO8601Basic(offset, FALSE, TRUE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_FIXED:
                formatOffsetISO8601Basic(offset, TRUE, FALSE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_LOCAL_FIXED:
                formatOffsetISO8601Basic(offset, FALSE, FALSE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_EXTENDED_FIXED:
                formatOffsetISO8601Extended(offset, TRUE, FALSE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FIXED:
                formatOffsetISO8601Extended(offset, FALSE, FALSE, TRUE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_FULL:
                formatOffsetISO8601Basic(offset, TRUE, FALSE, FALSE, name, status);
                break;

            case UTZFMT_STYLE_ISO_BASIC_LOCAL_FULL:
                formatOffsetISO8601Basic(offset, FALSE, FALSE, FALSE, name, status);
                break;

            case UTZFMT_STYLE_ISO_EXTENDED_FULL:
                formatOffsetISO8601Extended(offset, TRUE, FALSE, FALSE, name, status);
                break;

            case UTZFMT_STYLE_ISO_EXTENDED_LOCAL_FULL:
                formatOffsetISO8601Extended(offset, FALSE, FALSE, FALSE, name, status);
                break;

            default:
              // UTZFMT_STYLE_ZONE_ID, UTZFMT_STYLE_ZONE_ID_SHORT, UTZFMT_STYLE_EXEMPLAR_LOCATION
              break;
            }

            if (timeType) {
                *timeType = (dstOffset != 0) ? UTZFMT_TIME_TYPE_DAYLIGHT : UTZFMT_TIME_TYPE_STANDARD;
            }
        }
    }

    return name;
}